

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libauthretry.c
# Opt level: O1

long parse_auth_name(char *arg)

{
  int iVar1;
  long lVar2;
  
  if (arg != (char *)0x0) {
    iVar1 = curl_strequal(arg,"basic");
    lVar2 = 1;
    if (iVar1 == 0) {
      iVar1 = curl_strequal(arg,"digest");
      lVar2 = 2;
      if (iVar1 == 0) {
        iVar1 = curl_strequal(arg,"ntlm");
        lVar2 = (ulong)(iVar1 != 0) << 3;
      }
    }
    return lVar2;
  }
  return 0;
}

Assistant:

static long parse_auth_name(const char *arg)
{
  if(!arg)
    return CURLAUTH_NONE;
  if(curl_strequal(arg, "basic"))
    return CURLAUTH_BASIC;
  if(curl_strequal(arg, "digest"))
    return CURLAUTH_DIGEST;
  if(curl_strequal(arg, "ntlm"))
    return CURLAUTH_NTLM;
  return CURLAUTH_NONE;
}